

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transparency.cpp
# Opt level: O0

void __thiscall Transparency::Transparency(Transparency *this,Json *conf,BSDF *base)

{
  void *pvVar1;
  undefined8 *puVar2;
  long in_RDX;
  char *in_RDI;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *unaff_retaddr;
  Json *in_stack_00000218;
  BSDF *in_stack_00000220;
  string *in_stack_ffffffffffffff78;
  string local_58 [32];
  string *in_stack_ffffffffffffffc8;
  ScalarImage *in_stack_ffffffffffffffd0;
  char *key;
  
  key = in_RDI;
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(unaff_retaddr,in_RDI);
  BSDF::BSDF(in_stack_00000220,in_stack_00000218);
  *(undefined ***)in_RDI = &PTR_f_001e8c40;
  *(long *)(in_RDI + 0x28) = in_RDX;
  in_RDI[0x30] = '\0';
  in_RDI[0x31] = '\0';
  in_RDI[0x32] = '\0';
  in_RDI[0x33] = '\0';
  in_RDI[0x34] = '\0';
  in_RDI[0x35] = '\0';
  in_RDI[0x36] = '\0';
  in_RDI[0x37] = '\0';
  pvVar1 = operator_new(0x10);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(unaff_retaddr,key);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)in_stack_ffffffffffffff78);
  getpath(in_stack_ffffffffffffff78);
  ScalarImage::ScalarImage(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *(void **)(in_RDI + 0x30) = pvVar1;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string(local_58);
  if (in_RDX == 0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "transparency: unrecognized base material";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  return;
}

Assistant:

Transparency::Transparency(const Json& conf, BSDF* base):
	BSDF(conf["base"]), base(base)
{
	alphaTexture = new ScalarImage(getpath(conf["alpha"]));
	if (base == NULL)
		throw "transparency: unrecognized base material";
}